

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void printsub(Curl_easy *data,int direction,uchar *pointer,size_t length)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  ulong uVar5;
  curl_trc_feat *pcVar6;
  ulong uVar7;
  char *pcVar8;
  char *fmt;
  ulong uVar9;
  
  if (((data->set).field_0x8cd & 0x10) == 0) {
    return;
  }
  pcVar6 = (data->state).feat;
  if ((pcVar6 == (curl_trc_feat *)0x0) || (0 < pcVar6->log_level)) {
    pcVar8 = "SENT";
    if (direction == 0x3c) {
      pcVar8 = "RCVD";
    }
    Curl_infof(data,"%s IAC SB ",pcVar8);
  }
  if (length < 3) {
    if (length == 2) {
      if (((data->set).field_0x8cd & 0x10) == 0) {
        return;
      }
      pcVar6 = (data->state).feat;
      if ((pcVar6 != (curl_trc_feat *)0x0) && (pcVar6->log_level < 1)) {
        return;
      }
      Curl_infof(data,"(Empty suboption?)");
      return;
    }
    uVar7 = 0;
  }
  else {
    bVar1 = pointer[length - 2];
    uVar7 = (ulong)bVar1;
    bVar2 = pointer[length - 1];
    if (bVar2 != 0xf0 || bVar1 != 0xff) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data,"(terminated by ");
      }
      if (bVar1 < 0x28) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          pcVar8 = telnetoptions[uVar7];
LAB_0015609b:
          Curl_infof(data,"%s ",pcVar8);
        }
      }
      else {
        uVar4 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
        if (bVar1 < 0xec) {
          if (((uVar4 >> 0x1c & 1) != 0) &&
             ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
              (0 < pcVar6->log_level)))) {
            Curl_infof(data,"%u ",(ulong)bVar1);
          }
        }
        else if (((uVar4 >> 0x1c & 1) != 0) &&
                ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar6->log_level)))) {
          pcVar8 = telnetcmds[bVar1 - 0xec];
          goto LAB_0015609b;
        }
      }
      if (bVar2 < 0x28) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          pcVar8 = telnetoptions[bVar2];
LAB_0015614c:
          Curl_infof(data,"%s",pcVar8);
        }
      }
      else {
        uVar4 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
        if (bVar2 < 0xec) {
          if (((uVar4 >> 0x1c & 1) != 0) &&
             ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
              (0 < pcVar6->log_level)))) {
            Curl_infof(data,"%d");
          }
        }
        else if (((uVar4 >> 0x1c & 1) != 0) &&
                ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar6->log_level)))) {
          pcVar8 = telnetcmds[bVar2 - 0xec];
          goto LAB_0015614c;
        }
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data,", not IAC SE) ");
      }
    }
  }
  uVar9 = length - 2;
  uVar5 = (ulong)*pointer;
  if (uVar5 < 0x28) {
    if ((*pointer < 0x28) && ((0x8881000000U >> (uVar5 & 0x3f) & 1) != 0)) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        pcVar8 = telnetoptions[uVar5];
        fmt = "%s";
LAB_00156206:
        Curl_infof(data,fmt,pcVar8);
      }
    }
    else if ((((data->set).field_0x8cd & 0x10) != 0) &&
            ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level)
             ))) {
      pcVar8 = telnetoptions[uVar5];
      fmt = "%s (unsupported)";
      goto LAB_00156206;
    }
  }
  else if ((((data->set).field_0x8cd & 0x10) != 0) &&
          ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level)))
          ) {
    Curl_infof(data,"%d (unknown)",(ulong)pointer[uVar7]);
  }
  uVar3 = *pointer;
  if (uVar3 == '\x1f') {
    if (uVar9 < 5) {
      return;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return;
    }
    pcVar6 = (data->state).feat;
    if ((pcVar6 != (curl_trc_feat *)0x0) && (pcVar6->log_level < 1)) {
      return;
    }
    Curl_infof(data,"Width: %d ; Height: %d",
               (ulong)(ushort)(*(ushort *)(pointer + 1) << 8 | *(ushort *)(pointer + 1) >> 8),
               (ulong)(ushort)(*(ushort *)(pointer + 3) << 8 | *(ushort *)(pointer + 3) >> 8));
    return;
  }
  switch(pointer[1]) {
  case '\0':
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar6 = (data->state).feat;
      pcVar8 = " IS";
LAB_0015633e:
      if ((pcVar6 == (curl_trc_feat *)0x0) || (0 < pcVar6->log_level)) {
        Curl_infof(data,pcVar8);
      }
    }
    break;
  case '\x01':
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar6 = (data->state).feat;
      pcVar8 = " SEND";
      goto LAB_0015633e;
    }
    break;
  case '\x02':
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar6 = (data->state).feat;
      pcVar8 = " INFO/REPLY";
      goto LAB_0015633e;
    }
    break;
  case '\x03':
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar6 = (data->state).feat;
      pcVar8 = " NAME";
      goto LAB_0015633e;
    }
    break;
  default:
    goto switchD_001562da_default;
  }
  uVar3 = *pointer;
switchD_001562da_default:
  if ((uVar3 == '\x18') || (uVar3 == '#')) {
    pointer[uVar9] = '\0';
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level)))) {
      Curl_infof(data," \"%s\"",pointer + 2);
      return;
    }
  }
  else if (uVar3 == '\'') {
    if (pointer[1] == '\0') {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data," ");
      }
      for (uVar7 = 3; uVar7 < uVar9; uVar7 = (ulong)((int)uVar7 + 1)) {
        uVar4 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
        if (pointer[uVar7] == '\x01') {
          if (((uVar4 >> 0x1c & 1) != 0) &&
             ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
              (0 < pcVar6->log_level)))) {
            pcVar8 = " = ";
LAB_0015641f:
            Curl_infof(data,pcVar8);
          }
        }
        else if (pointer[uVar7] == '\0') {
          if (((uVar4 >> 0x1c & 1) != 0) &&
             ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
              (0 < pcVar6->log_level)))) {
            pcVar8 = ", ";
            goto LAB_0015641f;
          }
        }
        else if (((uVar4 >> 0x1c & 1) != 0) &&
                ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar6->log_level)))) {
          Curl_infof(data,"%c");
        }
      }
    }
  }
  else {
    for (uVar7 = 2; uVar7 < uVar9; uVar7 = (ulong)((int)uVar7 + 1)) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data," %.2x",(ulong)pointer[uVar7]);
      }
    }
  }
  return;
}

Assistant:

static void printsub(struct Curl_easy *data,
                     int direction,             /* '<' or '>' */
                     unsigned char *pointer,    /* where suboption data is */
                     size_t length)             /* length of suboption data */
{
  if(data->set.verbose) {
    unsigned int i = 0;
    if(direction) {
      infof(data, "%s IAC SB ", (direction == '<') ? "RCVD" : "SENT");
      if(length >= 3) {
        int j;

        i = pointer[length-2];
        j = pointer[length-1];

        if(i != CURL_IAC || j != CURL_SE) {
          infof(data, "(terminated by ");
          if(CURL_TELOPT_OK(i))
            infof(data, "%s ", CURL_TELOPT(i));
          else if(CURL_TELCMD_OK(i))
            infof(data, "%s ", CURL_TELCMD(i));
          else
            infof(data, "%u ", i);
          if(CURL_TELOPT_OK(j))
            infof(data, "%s", CURL_TELOPT(j));
          else if(CURL_TELCMD_OK(j))
            infof(data, "%s", CURL_TELCMD(j));
          else
            infof(data, "%d", j);
          infof(data, ", not IAC SE) ");
        }
      }
      length -= 2;
    }
    if(length < 1) {
      infof(data, "(Empty suboption?)");
      return;
    }

    if(CURL_TELOPT_OK(pointer[0])) {
      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
      case CURL_TELOPT_NEW_ENVIRON:
      case CURL_TELOPT_NAWS:
        infof(data, "%s", CURL_TELOPT(pointer[0]));
        break;
      default:
        infof(data, "%s (unsupported)", CURL_TELOPT(pointer[0]));
        break;
      }
    }
    else
      infof(data, "%d (unknown)", pointer[i]);

    switch(pointer[0]) {
    case CURL_TELOPT_NAWS:
      if(length > 4)
        infof(data, "Width: %d ; Height: %d", (pointer[1] << 8) | pointer[2],
              (pointer[3] << 8) | pointer[4]);
      break;
    default:
      switch(pointer[1]) {
      case CURL_TELQUAL_IS:
        infof(data, " IS");
        break;
      case CURL_TELQUAL_SEND:
        infof(data, " SEND");
        break;
      case CURL_TELQUAL_INFO:
        infof(data, " INFO/REPLY");
        break;
      case CURL_TELQUAL_NAME:
        infof(data, " NAME");
        break;
      }

      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
        pointer[length] = 0;
        infof(data, " \"%s\"", &pointer[2]);
        break;
      case CURL_TELOPT_NEW_ENVIRON:
        if(pointer[1] == CURL_TELQUAL_IS) {
          infof(data, " ");
          for(i = 3; i < length; i++) {
            switch(pointer[i]) {
            case CURL_NEW_ENV_VAR:
              infof(data, ", ");
              break;
            case CURL_NEW_ENV_VALUE:
              infof(data, " = ");
              break;
            default:
              infof(data, "%c", pointer[i]);
              break;
            }
          }
        }
        break;
      default:
        for(i = 2; i < length; i++)
          infof(data, " %.2x", pointer[i]);
        break;
      }
    }
  }
}